

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O3

bool __thiscall DOMTest::testCharacterData(DOMTest *this,DOMDocument *document)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  DOMNode *pDVar4;
  wchar16 *pwVar5;
  long lVar6;
  DOMDocument *pDVar7;
  DOMDocument *pDVar8;
  DOMDocument *pDVar9;
  XMLCh *pXVar10;
  DOMNode *pDVar11;
  DOMNode *pDVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  XMLCh resetData [3999];
  wchar16 local_1f78 [4004];
  
  xercesc_4_0::XMLString::transcode
            ("dBodyLevel31",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar3 = (long *)(**(code **)(*(long *)document + 0x68))(document);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x158))(plVar3,tempStr);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x10))(plVar3,0);
  pDVar4 = (DOMNode *)(**(code **)(*plVar3 + 0x38))(plVar3);
  xercesc_4_0::XMLString::transcode
            ("dBodyLevel31\'sChildTextNode11",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))(pDVar4);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  bVar13 = iVar2 == 0;
  if (!bVar13) {
    testCharacterData();
  }
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))(pDVar4);
  xercesc_4_0::XMLString::copyString(local_1f78,pwVar5);
  xercesc_4_0::XMLString::transcode
            (" This is new data for this node",tempStr2,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))(pDVar4);
  xercesc_4_0::XMLString::copyString(tempStr,pwVar5);
  xercesc_4_0::XMLString::catString(tempStr,tempStr2);
  (**(code **)(*(long *)pDVar4 + 0x158))(pDVar4,tempStr2);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))(pDVar4);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  bVar14 = iVar2 == 0;
  if (!bVar14) {
    testCharacterData();
  }
  xercesc_4_0::XMLString::transcode
            ("dBodyLevel",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,10,100);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))(pDVar4);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  bVar15 = iVar2 == 0;
  if (!bVar15) {
    testCharacterData();
  }
  lVar6 = (**(code **)(*(long *)pDVar4 + 0x148))(pDVar4);
  bVar16 = lVar6 == 10;
  if (!bVar16) {
    testCharacterData();
  }
  xercesc_4_0::XMLString::transcode
            ("dBody\' This is data inserted into this node\'Level",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("\' This is data inserted into this node\'",tempStr2,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x160))(pDVar4,5,tempStr2);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))(pDVar4);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  bVar17 = iVar2 == 0;
  if (!bVar17) {
    testCharacterData();
  }
  xercesc_4_0::XMLString::transcode
            ("dBody\' This is \' replacement data\'ted into this node\'Level",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("\' replacement data\'",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x170))(pDVar4,0xf,10,tempStr2);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))(pDVar4);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  bVar18 = iVar2 == 0;
  if (!bVar18) {
    testCharacterData();
  }
  xercesc_4_0::XMLString::transcode
            ("New data A123456789B123456789C123456789D123456789E123456789",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x178))(pDVar4,tempStr);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))(pDVar4);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  bVar19 = iVar2 == 0;
  if (!bVar19) {
    testCharacterData();
  }
  xercesc_4_0::XMLString::transcode
            ("123456789D123456789E123456789",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,0x1e,0x1e);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  bVar20 = iVar2 == 0;
  if (!bVar20) {
    testCharacterData();
  }
  xercesc_4_0::XMLString::transcode
            ("New data A123456789B12345",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
            );
  pwVar5 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,0,0x19);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar5);
  bVar21 = iVar2 == 0;
  if (!bVar21) {
    testCharacterData();
  }
  (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,0xffffffffffffffff,5);
  testCharacterData();
  (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,100,5);
  testCharacterData();
  xercesc_4_0::XMLString::transcode
            ("Stuff inserted",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x160))(pDVar4,100,tempStr);
  testCharacterData();
  xercesc_4_0::XMLString::transcode
            ("Replacement stuff",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x170))(pDVar4,100,5,tempStr);
  testCharacterData();
  (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,0xffffffffffffffff,5);
  testCharacterData();
  (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,100,5);
  testCharacterData();
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,0);
  pDVar7 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  bVar22 = pDVar7 == document;
  if (!bVar22) {
    testCharacterData();
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,document,0);
  pDVar8 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  bVar23 = pDVar8 == document;
  if (!bVar23) {
    testCharacterData();
  }
  pDVar8 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,tempStr2,0);
  pDVar9 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  bVar24 = pDVar9 == (DOMDocument *)tempStr2;
  if (!bVar24) {
    testCharacterData();
  }
  bVar25 = pDVar8 == document;
  if (!bVar25) {
    testCharacterData();
  }
  bVar26 = pDVar9 != document;
  if (!bVar26) {
    testCharacterData();
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr3);
  bVar27 = lVar6 == 0;
  if (!bVar27) {
    testCharacterData();
  }
  pDVar8 = document + 0x18;
  lVar6 = (**(code **)(*(long *)(document + 0x18) + 0xf0))(pDVar8,tempStr);
  bVar28 = lVar6 == 0;
  if (!bVar28) {
    testCharacterData();
  }
  pXVar10 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,0,0);
  lVar6 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  bVar29 = pXVar10 == tempStr2;
  if (!bVar29) {
    testCharacterData();
  }
  bVar30 = lVar6 == 0;
  if (!bVar30) {
    testCharacterData();
  }
  pDVar9 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,0,0);
  lVar6 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  bVar31 = pDVar7 == pDVar9;
  if (!bVar31) {
    testCharacterData();
  }
  bVar32 = lVar6 == 0;
  if (!bVar32) {
    testCharacterData();
  }
  lVar6 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  bVar33 = lVar6 == 0;
  if (!bVar33) {
    testCharacterData();
  }
  lVar6 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  bVar34 = lVar6 == 0;
  if (!bVar34) {
    testCharacterData();
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,&userhandler);
  pDVar11 = (DOMNode *)(**(code **)(*(long *)pDVar4 + 0x68))(pDVar4,1);
  bVar35 = userhandler.currentType == NODE_CLONED;
  if (!bVar35) {
    testCharacterData();
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  bVar36 = iVar2 == 0;
  if (!bVar36) {
    testCharacterData();
  }
  bVar37 = (DOMDocument *)userhandler.currentData == document;
  if (!bVar37) {
    testCharacterData();
  }
  bVar38 = userhandler.currentSrc == pDVar4;
  if (!bVar38) {
    testCharacterData();
  }
  bVar39 = userhandler.currentDst == pDVar11;
  if (!bVar39) {
    testCharacterData();
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(pDVar8,tempStr2,document,&userhandler);
  pDVar12 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar4,1);
  bVar40 = userhandler.currentType == NODE_IMPORTED;
  if (!bVar40) {
    testCharacterData();
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  bVar41 = iVar2 == 0;
  if (!bVar41) {
    testCharacterData();
  }
  bVar42 = (DOMDocument *)userhandler.currentData == document;
  if (!bVar42) {
    testCharacterData();
  }
  bVar43 = userhandler.currentSrc == pDVar4;
  if (!bVar43) {
    testCharacterData();
  }
  bVar44 = userhandler.currentDst == pDVar12;
  if (!bVar44) {
    testCharacterData();
  }
  (**(code **)(*(long *)pDVar12 + 0xe8))(pDVar12,tempStr2,pDVar4,&userhandler);
  (**(code **)(*(long *)pDVar12 + 0x138))(pDVar12);
  bVar45 = userhandler.currentType == NODE_DELETED;
  if (!bVar45) {
    testCharacterData();
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  bVar46 = iVar2 == 0;
  if (!bVar46) {
    testCharacterData();
  }
  bVar47 = (DOMNode *)userhandler.currentData == pDVar4;
  if (!bVar47) {
    testCharacterData();
  }
  bVar48 = userhandler.currentSrc == (DOMNode *)0x0;
  if (!bVar48) {
    testCharacterData();
  }
  bVar49 = userhandler.currentDst == (DOMNode *)0x0;
  if (!bVar49) {
    testCharacterData();
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pDVar4);
  bVar50 = cVar1 != '\0';
  if (!bVar50) {
    testCharacterData();
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pDVar8);
  bVar51 = cVar1 == '\0';
  if (!bVar51) {
    testCharacterData();
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar11);
  bVar52 = cVar1 != '\0';
  if (!bVar52) {
    testCharacterData();
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar4);
  bVar53 = cVar1 != '\0';
  if (!bVar53) {
    testCharacterData();
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar8);
  bVar54 = cVar1 == '\0';
  if (!bVar54) {
    testCharacterData();
  }
  (**(code **)(*(long *)document + 0xf0))(document,pDVar4,0,tempStr2);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0xcd);
  if (!bVar54 ||
      (!bVar53 ||
      (!bVar52 ||
      (!bVar51 ||
      (!bVar50 ||
      (!bVar49 ||
      (!bVar48 ||
      (!bVar47 ||
      (!bVar46 ||
      (!bVar45 ||
      (!bVar44 ||
      (!bVar43 ||
      (!bVar42 ||
      (!bVar41 ||
      (!bVar40 ||
      (!bVar39 ||
      (!bVar38 ||
      (!bVar37 ||
      (!bVar36 ||
      (!bVar35 ||
      (!bVar34 ||
      (!bVar33 ||
      (!bVar32 ||
      (!bVar31 ||
      (!bVar30 ||
      (!bVar29 ||
      (!bVar28 ||
      (!bVar27 ||
      (!bVar26 ||
      (!bVar25 ||
      (!bVar24 ||
      (!bVar23 ||
      (!bVar22 ||
      (!bVar21 ||
      (!bVar20 ||
      (!bVar19 || (!bVar18 || (!bVar17 || (!bVar16 || (!bVar15 || (!bVar14 || !bVar13)))))))))))))))
      )))))))))))))))))))))))))) {
    puts(
        "\n*****The DOMCharacterData method calls listed above failed, all others worked correctly.*****"
        );
  }
  (**(code **)(*(long *)pDVar4 + 0x178))(pDVar4,local_1f78);
  return bVar54 && (bVar53 &&
                   (bVar52 &&
                   (bVar51 &&
                   (bVar50 &&
                   (bVar49 &&
                   (bVar48 &&
                   (bVar47 &&
                   (bVar46 &&
                   (bVar45 &&
                   (bVar44 &&
                   (bVar43 &&
                   (bVar42 &&
                   (bVar41 &&
                   (bVar40 &&
                   (bVar39 &&
                   (bVar38 &&
                   (bVar37 &&
                   (bVar36 &&
                   (bVar35 &&
                   (bVar34 &&
                   (bVar33 &&
                   (bVar32 &&
                   (bVar31 &&
                   (bVar30 &&
                   (bVar29 &&
                   (bVar28 &&
                   (bVar27 &&
                   (bVar26 &&
                   (bVar25 &&
                   (bVar24 &&
                   (bVar23 &&
                   (bVar22 &&
                   (bVar21 &&
                   (bVar20 &&
                   (bVar19 && (bVar18 && (bVar17 && (bVar16 && (bVar15 && (bVar14 && bVar13)))))))))
                   )))))))))))))))))))))))))))))));
}

Assistant:

bool DOMTest::testCharacterData(DOMDocument* document)
{
    DOMCharacterData* charData;
    XMLCh resetData[3999];
    bool OK = true;
// For debugging*****   printf("\n          testCharacterData's outputs:\n");
    XMLString::transcode("dBodyLevel31", tempStr, 3999);
    DOMNode*  abc1 = document->getDocumentElement()->getElementsByTagName(tempStr)->item(0)->getFirstChild(); // charData gets textNode11

    charData = (DOMCharacterData *) abc1;

    XMLString::transcode("dBodyLevel31'sChildTextNode11", tempStr, 3999);
    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'getData' failed to work properly!\n This may corrupt other DOMCharacterData tests!!!*****\n");
        OK = false;
    }

    XMLString::copyString(resetData,charData->getData());
    //  printf("This node's original data is: " + charData->getData());

    XMLString::transcode(" This is new data for this node", tempStr2, 3999);

    XMLString::copyString(tempStr, charData->getData());
    XMLString::catString(tempStr, tempStr2);

    charData->appendData(tempStr2);


    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'appendData' failed to work properly!\n");
        OK = false;
    }
    //  printf("This node's appended data is: " + charData->getData());

    XMLString::transcode("dBodyLevel", tempStr, 3999);
    charData->deleteData(10, 100);
    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'deleteData' failed to work properly!\n");
        OK = false;
    }
    //  printf("This node's partially deleted data is: " + charData->getData());

    XMLSize_t length = 10;
    if (!(length == charData->getLength()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'getLength' failed to work properly!\n");
        OK = false;
    }
    //  printf("This node's data length is: " + charData->getLength());

    XMLString::transcode("dBody' This is data inserted into this node'Level", tempStr, 3999);
    XMLString::transcode("' This is data inserted into this node'", tempStr2, 3999);
    charData->insertData(5, tempStr2);
    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'insertData' failed to work properly!\n");
        OK = false;
    }
    //  printf("This node's updated with insert data is: " + charData->getData());

    XMLString::transcode("dBody' This is ' replacement data'ted into this node'Level", tempStr, 3999);
    XMLString::transcode("' replacement data'", tempStr2, 3999);
    charData->replaceData(15, 10, tempStr2);
    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'replaceData' failed to work properly!\n");
        OK = false;
    }
    //  printf("This node's updated with replacement data is: " +charData->getData());

    XMLString::transcode("New data A123456789B123456789C123456789D123456789E123456789", tempStr, 3999);
    charData->setData(tempStr);
    if (XMLString::compareString(tempStr, charData->getData()))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'setData' failed to work properly!");
        OK = false;
    }
    //  printf("This node's new data via setData: " + charData->getData());

    XMLString::transcode("123456789D123456789E123456789", tempStr, 3999);
    if (XMLString::compareString(tempStr, charData->substringData(30, 30)))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'substringData' failed to work properly!\n");
        OK = false;
    }
    //  printf("Using subString 30,30 you get:");  charData->substringData(30,30)).print();

    XMLString::transcode("New data A123456789B12345", tempStr, 3999);
    if (XMLString::compareString(tempStr, charData->substringData(0, 25)))
    {
        fprintf(stderr, "Warning!!! DOMCharacterData's 'substringData' failed to work properly!\n");
        OK = false;
    }
    //  printf("Using subString 0,25 you get: ");   charData->substringData(0,25)).print();

//************************************************* ERROR TESTS
    DOMTest tests;   // What is this for?  'tests' is never used.

//!! Throws INDEX_SIZE_ERR ********************
    EXCEPTIONSTEST(charData->deleteData((XMLSize_t)-1, 5), DOMException::INDEX_SIZE_ERR, OK, 101 );
    // Test 102 is not an error because the -1 parameter is an unsigned value, and counts
    //   that exceed the length of the string are allowed.
//    EXCEPTIONSTEST(charData->deleteData(2, -1), DOMException::INDEX_SIZE_ERR, OK, 102 );
    EXCEPTIONSTEST(charData->deleteData(100, 5), DOMException::INDEX_SIZE_ERR, OK,103 );

//can't set negative XMLSize_t in c++ compiler

  //  EXCEPTIONSTEST(charData->insertData(-1, "Stuff inserted"), DOMException::INDEX_SIZE_ERR, OK, 104 );
    XMLString::transcode("Stuff inserted", tempStr, 3999);
    EXCEPTIONSTEST(charData->insertData(100, tempStr), DOMException::INDEX_SIZE_ERR, OK, 105 );

  //  EXCEPTIONSTEST(charData->replaceData(-1, 5, "Replacement stuff") , DOMException::INDEX_SIZE_ERR, OK, 106 );
    XMLString::transcode("Replacement stuff", tempStr, 3999);
    EXCEPTIONSTEST(charData->replaceData(100, 5 ,tempStr), DOMException::INDEX_SIZE_ERR, OK, 107 );
  //  EXCEPTIONSTEST(charData->replaceData(2, -1, "Replacement stuff"), DOMException::INDEX_SIZE_ERR,  OK, 108 );

    EXCEPTIONSTEST(charData->substringData((XMLSize_t)-1, 5), DOMException::INDEX_SIZE_ERR, OK, 109 );
    EXCEPTIONSTEST(charData->substringData(100, 5), DOMException::INDEX_SIZE_ERR, OK, 110 );
 //   EXCEPTIONSTEST(charData->substringData(2, -1), DOMException::INDEX_SIZE_ERR, OK, 111 );


    // Test the user data
    // Test simple set and get
    DOMCharacterData* userTest = charData;
    DOMDocument*  userFirst = document;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (userFirst->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(userFirst)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test rename, should throw exception
    EXCEPTIONSTEST(document->renameNode(userTest, 0, tempStr2), DOMException::NOT_SUPPORTED_ERR, OK, 205 );

    if (!OK)
        printf("\n*****The DOMCharacterData method calls listed above failed, all others worked correctly.*****\n");
    charData->setData(resetData); // reset node to original data
    return OK;
}